

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 uVar1;
  LogMessage *other;
  pointer pUVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  ulong uVar4;
  long lVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x9e);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: fields_ != NULL: ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (0 < num) {
    uVar4 = (ulong)(uint)num;
    lVar5 = (long)start << 4;
    do {
      UnknownField::Delete
                ((UnknownField *)
                 (&((this->fields_->
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    )._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar5));
      lVar5 = lVar5 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  uVar4 = (ulong)(start + num);
  pvVar3 = this->fields_;
  pUVar2 = (pvVar3->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(pvVar3->
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4)) {
    lVar5 = uVar4 << 4;
    do {
      uVar1 = *(undefined8 *)((long)(&pUVar2->field_0x0 + lVar5) + 8);
      *(undefined8 *)(&pUVar2[-(long)num].field_0x0 + lVar5) =
           *(undefined8 *)(&pUVar2->field_0x0 + lVar5);
      *(undefined8 *)((long)(&pUVar2[-(long)num].field_0x0 + lVar5) + 8) = uVar1;
      uVar4 = uVar4 + 1;
      pvVar3 = this->fields_;
      pUVar2 = (pvVar3->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(pvVar3->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4))
    ;
  }
  if (0 < num) {
    (pvVar3->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         (pvVar3->
         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
         )._M_impl.super__Vector_impl_data._M_finish + (-1 - (ulong)(num - 1));
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK(fields_ != NULL);
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
}